

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O1

int ncnn::convolutiondepthwise1d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int stride_w,int dilation_w,int group,int activation_type,Mat *activation_params,
              Option *opt)

{
  float fVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  size_t sVar5;
  float *pfVar6;
  uint uVar7;
  int iVar8;
  float *pfVar9;
  ulong uVar10;
  void *pvVar11;
  long lVar12;
  float *pfVar13;
  long lVar14;
  ulong uVar15;
  float *pfVar16;
  ulong uVar17;
  ulong uVar18;
  void *pvVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  int local_114;
  float *local_110;
  ulong local_f0;
  ulong local_c8;
  void *local_a8;
  undefined8 uStack_a0;
  
  uVar7 = bottom_blob->h;
  uVar15 = (ulong)uVar7;
  iVar2 = top_blob->w;
  lVar12 = (long)iVar2;
  pvVar3 = bias_data->data;
  if (pvVar3 == (void *)0x0) {
    bVar22 = true;
  }
  else {
    bVar22 = (long)bias_data->c * bias_data->cstep == 0;
  }
  if (top_blob->h == group && uVar7 == group) {
    if (0 < group) {
      pvVar4 = top_blob->data;
      sVar5 = top_blob->elemsize;
      pvVar19 = weight_data->data;
      local_110 = (float *)bottom_blob->data;
      uVar15 = (long)bottom_blob->w * bottom_blob->elemsize;
      uVar18 = 0;
      do {
        if (0 < iVar2) {
          pfVar6 = (float *)activation_params->data;
          lVar21 = 0;
          pfVar13 = local_110;
          do {
            fVar25 = 0.0;
            if (!bVar22) {
              fVar25 = *(float *)((long)pvVar3 + uVar18 * 4);
            }
            if (0 < kernel_w) {
              uVar10 = 0;
              pfVar9 = pfVar13;
              do {
                fVar25 = fVar25 + *(float *)((long)pvVar19 + uVar10 * 4) * *pfVar9;
                uVar10 = uVar10 + 1;
                pfVar9 = pfVar9 + dilation_w;
              } while ((uint)kernel_w != uVar10);
            }
            fVar23 = fVar25;
            switch(activation_type) {
            case 1:
              if (fVar25 <= 0.0) {
                fVar23 = 0.0;
              }
              break;
            case 2:
              fVar23 = (float)(~-(uint)(0.0 < fVar25) & (uint)*pfVar6 |
                              -(uint)(0.0 < fVar25) & 0x3f800000) * fVar25;
              break;
            case 3:
              if (fVar25 <= *pfVar6) {
                fVar25 = *pfVar6;
              }
              fVar23 = fVar25;
              if (pfVar6[1] <= fVar25) {
                fVar23 = pfVar6[1];
              }
              break;
            case 4:
              fVar25 = expf(-fVar25);
              fVar23 = 1.0 / (fVar25 + 1.0);
              break;
            case 5:
              fVar23 = expf(fVar25);
              fVar23 = logf(fVar23 + 1.0);
              fVar23 = tanhf(fVar23);
              fVar23 = fVar23 * fVar25;
              break;
            case 6:
              fVar1 = *pfVar6;
              fVar24 = -pfVar6[1] / fVar1;
              fVar23 = 0.0;
              if ((fVar24 <= fVar25) && (fVar23 = fVar25, fVar25 <= fVar24 + 1.0 / fVar1)) {
                fVar23 = (fVar1 * fVar25 + pfVar6[1]) * fVar25;
              }
            }
            *(float *)((long)pvVar4 + lVar21 * 4 + sVar5 * lVar12 * uVar18) = fVar23;
            lVar21 = lVar21 + 1;
            pfVar13 = pfVar13 + stride_w;
          } while (lVar21 != lVar12);
        }
        uVar18 = uVar18 + 1;
        pvVar19 = (void *)((long)pvVar19 + (long)kernel_w * 4);
        local_110 = (float *)((long)local_110 + uVar15);
      } while (uVar18 != (uint)group);
    }
  }
  else {
    uVar7 = (int)uVar7 / group;
    uVar18 = (long)top_blob->h / (long)group;
    uVar15 = uVar18 & 0xffffffff;
    iVar8 = (int)uVar18;
    if (0 < group) {
      pvVar4 = top_blob->data;
      sVar5 = top_blob->elemsize;
      pvVar19 = weight_data->data;
      uVar15 = 0;
      local_114 = 0;
      local_c8 = 0;
      do {
        if (0 < iVar8) {
          local_a8 = (void *)((long)pvVar19 + (long)local_114 * 4);
          local_f0 = 0;
          do {
            if (0 < iVar2) {
              lVar21 = local_f0 + local_c8 * (long)iVar8;
              pfVar6 = (float *)activation_params->data;
              lVar20 = (long)bottom_blob->w * bottom_blob->elemsize;
              pfVar13 = (float *)(lVar20 * uVar15 + (long)bottom_blob->data);
              lVar14 = 0;
              do {
                fVar25 = 0.0;
                if (!bVar22) {
                  fVar25 = *(float *)((long)pvVar3 + lVar21 * 4);
                }
                if (0 < (int)uVar7) {
                  uVar10 = 0;
                  pfVar9 = pfVar13;
                  pvVar11 = local_a8;
                  do {
                    if (0 < kernel_w) {
                      uVar17 = 0;
                      pfVar16 = pfVar9;
                      do {
                        fVar25 = fVar25 + *(float *)((long)pvVar11 + uVar17 * 4) * *pfVar16;
                        uVar17 = uVar17 + 1;
                        pfVar16 = pfVar16 + dilation_w;
                      } while ((uint)kernel_w != uVar17);
                    }
                    uVar10 = uVar10 + 1;
                    pvVar11 = (void *)((long)pvVar11 + (long)kernel_w * 4);
                    pfVar9 = (float *)((long)pfVar9 + lVar20);
                  } while (uVar10 != uVar7);
                }
                fVar23 = fVar25;
                switch(activation_type) {
                case 1:
                  if (fVar25 <= 0.0) {
                    fVar23 = 0.0;
                  }
                  break;
                case 2:
                  fVar23 = (float)(~-(uint)(0.0 < fVar25) & (uint)*pfVar6 |
                                  -(uint)(0.0 < fVar25) & 0x3f800000) * fVar25;
                  break;
                case 3:
                  if (fVar25 <= *pfVar6) {
                    fVar25 = *pfVar6;
                  }
                  fVar23 = fVar25;
                  if (pfVar6[1] <= fVar25) {
                    fVar23 = pfVar6[1];
                  }
                  break;
                case 4:
                  fVar25 = expf(-fVar25);
                  fVar23 = 1.0 / (fVar25 + 1.0);
                  break;
                case 5:
                  fVar23 = expf(fVar25);
                  fVar23 = logf(fVar23 + 1.0);
                  fVar23 = tanhf(fVar23);
                  fVar23 = fVar23 * fVar25;
                  break;
                case 6:
                  fVar1 = *pfVar6;
                  fVar24 = -pfVar6[1] / fVar1;
                  fVar23 = 0.0;
                  if ((fVar24 <= fVar25) && (fVar23 = fVar25, fVar25 <= fVar24 + 1.0 / fVar1)) {
                    fVar23 = (fVar1 * fVar25 + pfVar6[1]) * fVar25;
                  }
                }
                *(float *)((long)pvVar4 + lVar14 * 4 + sVar5 * lVar12 * lVar21) = fVar23;
                lVar14 = lVar14 + 1;
                pfVar13 = pfVar13 + stride_w;
              } while (lVar14 != lVar12);
            }
            local_f0 = local_f0 + 1;
            local_a8 = (void *)((long)local_a8 + (long)(int)(uVar7 * kernel_w) * 4);
          } while (local_f0 != (uVar18 & 0xffffffff));
        }
        local_c8 = local_c8 + 1;
        local_114 = local_114 + uVar7 * kernel_w * iVar8;
        uVar15 = (ulong)((int)uVar15 + uVar7);
      } while (local_c8 != (uint)group);
    }
  }
  return (int)uVar15;
}

Assistant:

static int convolutiondepthwise1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    // depth-wise
    if (h == group && group == outh)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.row(g);
            const float* kptr = (const float*)weight_data + kernel_w * g;

            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[g];

                const float* sptr = bottom_blob.row(g) + j * stride_w;

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = *sptr;
                    float w = kptr[k];
                    sum += val * w;

                    sptr += dilation_w;
                }

                outptr[j] = activation_ss(sum, activation_type, activation_params);
            }
        }
    }
    else
    {
        // group convolution
        const int h_g = h / group;
        const int outh_g = outh / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outh_g; p++)
            {
                float* outptr = top_blob.row(g * outh_g + p);
                const float* weight_data_ptr = (const float*)weight_data + kernel_w * h_g * outh_g * g;

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[outh_g * g + p];

                    const float* kptr = weight_data_ptr + kernel_w * h_g * p;

                    for (int q = 0; q < h_g; q++)
                    {
                        const float* sptr = bottom_blob.row(h_g * g + q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = *sptr;
                            float w = kptr[k];
                            sum += val * w;

                            sptr += dilation_w;
                        }

                        kptr += kernel_w;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }
            }
        }
    }

    return 0;
}